

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O3

int add_pax_acl(archive_write *a,archive_entry *entry,pax *pax,int flags)

{
  wchar_t wVar1;
  char *__s;
  size_t value_len;
  int *piVar2;
  char *key;
  int iVar3;
  
  wVar1 = archive_entry_acl_types(entry);
  if ((wVar1 & 0x3c00U) == 0) {
    if (((uint)flags >> 8 & 1) == 0) {
      if (((uint)flags >> 9 & 1) == 0) {
        return -0x1e;
      }
      key = "SCHILY.acl.default";
    }
    else {
      key = "SCHILY.acl.access";
    }
  }
  else {
    key = "SCHILY.acl.ace";
  }
  iVar3 = 0;
  __s = _archive_entry_acl_to_text_l(entry,(ssize_t *)0x0,flags,pax->sconv_utf8);
  if (__s == (char *)0x0) {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      archive_set_error(&a->archive,0xc,"%s %s","Can\'t allocate memory for ",key);
      iVar3 = -0x1e;
    }
    else {
      archive_set_error(&a->archive,0x54,"%s %s %s","Can\'t translate ",key," to UTF-8");
      iVar3 = -0x14;
    }
  }
  else if (*__s != '\0') {
    value_len = strlen(__s);
    add_pax_attr_binary(&pax->pax_header,key,__s,value_len);
    free(__s);
  }
  return iVar3;
}

Assistant:

static int
add_pax_acl(struct archive_write *a,
    struct archive_entry *entry, struct pax *pax, int flags)
{
	char *p;
	const char *attr;
	int acl_types;

	acl_types = archive_entry_acl_types(entry);

	if ((acl_types & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0)
		attr = "SCHILY.acl.ace";
	else if ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0)
		attr = "SCHILY.acl.access";
	else if ((flags & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0)
		attr = "SCHILY.acl.default";
	else
		return (ARCHIVE_FATAL);

	p = archive_entry_acl_to_text_l(entry, NULL, flags, pax->sconv_utf8);
	if (p == NULL) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM, "%s %s",
			    "Can't allocate memory for ", attr);
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT, "%s %s %s",
		    "Can't translate ", attr, " to UTF-8");
		return(ARCHIVE_WARN);
	} else if (*p != '\0') {
		add_pax_attr(&(pax->pax_header),
		    attr, p);
		free(p);
	}
	return(ARCHIVE_OK);
}